

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.hpp
# Opt level: O0

void __thiscall ws::Server::Server(Server *this)

{
  anon_class_1_0_00000001 local_1d [13];
  Server *local_10;
  Server *this_local;
  
  this->inited = false;
  local_10 = this;
  std::__cxx11::string::string((string *)&this->host);
  this->port = -1;
  Crypto::Crypto(&this->crypto);
  Cli::Cli(&this->wxcli);
  httplib::Server::Server(&this->svr);
  std::function<void_(const_ws::Request_&,_ws::Message_&)>::function(&this->msg_handle);
  std::function<httplib::TaskQueue*()>::function<ws::Server::Server()::_lambda()_1_,void>
            ((function<httplib::TaskQueue*()> *)&this->new_task_queue,local_1d);
  return;
}

Assistant:

Server() : inited(false), port(-1),
               new_task_queue([] { return new httplib::ThreadPool(4); }) {}